

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall Cube::setupBackFace(Cube *this)

{
  int i;
  long lVar1;
  undefined8 local_48;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  undefined8 local_30;
  float local_28;
  undefined8 local_24;
  float local_1c;
  undefined8 local_18;
  float local_10;
  float local_c;
  float local_8;
  float local_4;
  
  local_40 = this->z;
  local_34 = local_40;
  local_48._0_4_ = this->x;
  local_48._4_4_ = this->y;
  local_3c = this->l + (float)(undefined4)local_48;
  local_8 = this->h + (float)local_48._4_4_;
  local_38 = (float)local_48._4_4_;
  local_30 = CONCAT44(local_8,local_3c);
  local_28 = local_40;
  local_24 = local_48;
  local_1c = local_40;
  local_18 = CONCAT44(local_8,local_3c);
  local_10 = local_40;
  local_c = (float)(undefined4)local_48;
  local_4 = local_40;
  for (lVar1 = 0; lVar1 != 0x12; lVar1 = lVar1 + 1) {
    this->positionData[lVar1 + 0x12] = *(float *)((long)&local_48 + lVar1 * 4);
  }
  return;
}

Assistant:

void setupBackFace() {
        float backFace[]={
            x,y,z,
            x+l,y,z,
            x+l,y+h,z,
            x,y,z,


            x+l,y+h,z,
            x,y+h,z
        };
        arrayCopy(backFace,positionData,18);
    }